

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<int,unsigned_long,4>::
     ModulusThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int *t,unsigned_long *u,int *result)

{
  uint32_t uVar1;
  int iVar2;
  
  if (*u != 0) {
    iVar2 = *t;
    if ((long)iVar2 < 0) {
      uVar1 = AbsValueHelper<int,_0>::Abs(iVar2);
      iVar2 = -(int)((ulong)uVar1 % *u);
    }
    else {
      iVar2 = (int)((ulong)(long)iVar2 % *u);
    }
    *result = iVar2;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //t could be negative - if so, need to convert to positive
        if(t < 0)
            result = (T)( ~( AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( t ) % u ) + 1);
        else
            result = (T)( (T)t % u );
    }